

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::GetVertexArrayIndexedTest::Check
          (GetVertexArrayIndexedTest *this,GLenum pname,GLuint index,GLint expected)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  Enum<int,_2UL> EVar6;
  Enum<int,_2UL> local_398;
  MessageBuilder local_388;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1f8;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  int local_38;
  int local_34;
  GLenum error;
  GLint result;
  Functions *gl;
  GLuint local_20;
  GLint expected_local;
  GLuint index_local;
  GLenum pname_local;
  GetVertexArrayIndexedTest *this_local;
  
  gl._4_4_ = expected;
  local_20 = index;
  expected_local = pname;
  _index_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _error = CONCAT44(extraout_var,iVar1);
  local_34 = 0;
  (**(code **)(_error + 0xb80))(this->m_vao,local_20,expected_local,&local_34);
  local_38 = (**(code **)(_error + 0x800))();
  if (local_38 == 0) {
    if (local_34 == gl._4_4_) {
      this_local._7_1_ = true;
    }
    else {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_388,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_388,(char (*) [43])"GetVertexArrayIndexediv called with index ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_20);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])" and with pname");
      EVar6 = glu::getVertexAttribParameterNameStr(expected_local);
      local_398.m_getName = EVar6.m_getName;
      local_398.m_value = EVar6.m_value;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_398);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x2c59535);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_34);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2a6afaf);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)((long)&gl + 4));
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [27])0x2a767ba);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_388);
      this_local._7_1_ = false;
    }
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_1b8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [43])"GetVertexArrayIndexediv called with index ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_20);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])", with pname");
    EVar6 = glu::getVertexAttribParameterNameStr(expected_local);
    local_1e8 = EVar6.m_getName;
    local_1e0 = EVar6.m_value;
    local_1d8[0].m_getName = local_1e8;
    local_1d8[0].m_value = local_1e0;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1d8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [25])0x2a6ae33);
    EVar6 = glu::getErrorStr(local_38);
    local_208 = EVar6.m_getName;
    local_200 = EVar6.m_value;
    local_1f8.m_getName = local_208;
    local_1f8.m_value = local_200;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1f8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [19])0x2a6abce);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool GetVertexArrayIndexedTest::Check(const glw::GLenum pname, const glw::GLuint index, const glw::GLint expected)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint result = 0;

	gl.getVertexArrayIndexediv(m_vao, index, pname, &result);

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetVertexArrayIndexediv called with index "
											<< index << ", with pname" << glu::getVertexAttribParameterNameStr(pname)
											<< " unexpectedly generated " << glu::getErrorStr(error)
											<< "error. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	if (result != expected)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetVertexArrayIndexediv called with index "
											<< index << " and with pname" << glu::getVertexAttribParameterNameStr(pname)
											<< " returned " << result << ", but " << expected
											<< " was expected. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}